

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O2

int Am_Center_X_Is_Center_Of_Owner_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object center_x_obj;
  
  iVar3 = 0;
  pAVar4 = Am_Object::Get(self,0x66,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Get_Owner(&center_x_obj,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&center_x_obj);
  if (bVar1) {
    pAVar4 = Am_Object::Get(&center_x_obj,0x66,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    iVar3 = (iVar3 - iVar2) / 2;
  }
  Am_Object::~Am_Object(&center_x_obj);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, Am_Center_X_Is_Center_Of_Owner)
{
  int my_width = self.Get(Am_WIDTH);
  Am_Object center_x_obj = self.Get_Owner();
  if (center_x_obj.Valid()) {
    int center_x_obj_width = center_x_obj.Get(Am_WIDTH);
    return (center_x_obj_width - my_width) / 2;
  } else {
    return 0;
  }
}